

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::rowSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int p_col;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  pointer pnVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  pval;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  piVar6 = (this->row).perm;
  piVar7 = (this->u).row.len;
  piVar8 = (this->temp).s_mark;
  lVar17 = (long)(this->temp).stage;
  for (lVar15 = 0; lVar15 < this->thedim; lVar15 = lVar15 + 1) {
    if ((piVar6[lVar15] < 0) && (piVar7[lVar15] == 1)) {
      iVar2 = (this->temp).stage;
      (this->temp).stage = iVar2 + 1;
      piVar8[iVar2] = (int)lVar15;
    }
  }
  do {
    if ((this->temp).stage <= lVar17) {
      return;
    }
    iVar2 = piVar8[lVar17];
    iVar3 = (this->u).row.start[iVar2];
    pnVar9 = (this->u).row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_col = (this->u).row.idx[iVar3];
    local_128.data._M_elems._0_8_ = *(undefined8 *)pnVar9[iVar3].m_backend.data._M_elems;
    local_128.data._M_elems._8_8_ = *(undefined8 *)((long)pnVar9[iVar3].m_backend.data._M_elems + 8)
    ;
    puVar1 = (uint *)((long)pnVar9[iVar3].m_backend.data._M_elems + 0x10);
    local_128.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)pnVar9[iVar3].m_backend.data._M_elems + 0x20);
    local_128.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_128.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)((long)pnVar9[iVar3].m_backend.data._M_elems + 0x30);
    local_128.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_128.data._M_elems._56_5_ = local_88.m_backend.data._M_elems._56_5_;
    local_128.data._M_elems[0xf]._1_3_ = local_88.m_backend.data._M_elems[0xf]._1_3_;
    local_128.exp = pnVar9[iVar3].m_backend.exp;
    local_128.neg = pnVar9[iVar3].m_backend.neg;
    local_88.m_backend.fpclass = pnVar9[iVar3].m_backend.fpclass;
    local_88.m_backend.prec_elem = pnVar9[iVar3].m_backend.prec_elem;
    local_128.prec_elem = local_88.m_backend.prec_elem;
    local_128.fpclass = local_88.m_backend.fpclass;
    local_88.m_backend.data._M_elems._0_8_ = local_128.data._M_elems._0_8_;
    local_88.m_backend.data._M_elems._8_8_ = local_128.data._M_elems._8_8_;
    local_88.m_backend.data._M_elems._16_8_ = local_128.data._M_elems._16_8_;
    local_88.m_backend.data._M_elems._24_8_ = local_128.data._M_elems._24_8_;
    local_88.m_backend.data._M_elems._32_8_ = local_128.data._M_elems._32_8_;
    local_88.m_backend.data._M_elems._40_8_ = local_128.data._M_elems._40_8_;
    local_88.m_backend.data._M_elems._48_8_ = local_128.data._M_elems._48_8_;
    local_88.m_backend.exp = local_128.exp;
    local_88.m_backend.neg = local_128.neg;
    setPivot(this,(int)lVar17,p_col,iVar2,&local_88);
    (this->u).row.len[iVar2] = 0;
    iVar3 = (this->u).col.start[p_col];
    piVar6 = (this->u).col.idx;
    iVar13 = (this->temp).s_cact[p_col];
    iVar12 = makeLvec(this,iVar13 + -1,iVar2);
    piVar7 = (this->u).col.len;
    iVar4 = piVar7[p_col];
    iVar13 = iVar4 - iVar13;
    piVar7[p_col] = iVar13;
    for (lVar15 = (long)iVar13; lVar15 < iVar4; lVar15 = lVar15 + 1) {
      iVar13 = piVar6[iVar3 + lVar15];
      if (iVar13 != iVar2) {
        piVar7 = (this->u).row.len;
        iVar5 = piVar7[iVar13];
        piVar7[iVar13] = iVar5 + -1;
        lVar14 = (long)(iVar5 + -1 + (this->u).row.start[iVar13]);
        lVar10 = lVar14 * 0x50 + 0x50;
        lVar11 = lVar14 * 4;
        do {
          lVar18 = lVar11;
          lVar16 = lVar10;
          lVar10 = lVar16 + -0x50;
          lVar11 = lVar18 + -4;
        } while (*(int *)((long)(this->u).row.idx + lVar18) != p_col);
        (this->l).idx[iVar12] = iVar13;
        local_d8.fpclass = cpp_dec_float_finite;
        local_d8.prec_elem = 0x10;
        local_d8.data._M_elems[0] = 0;
        local_d8.data._M_elems[1] = 0;
        local_d8.data._M_elems[2] = 0;
        local_d8.data._M_elems[3] = 0;
        local_d8.data._M_elems[4] = 0;
        local_d8.data._M_elems[5] = 0;
        local_d8.data._M_elems[6] = 0;
        local_d8.data._M_elems[7] = 0;
        local_d8.data._M_elems[8] = 0;
        local_d8.data._M_elems[9] = 0;
        local_d8.data._M_elems[10] = 0;
        local_d8.data._M_elems[0xb] = 0;
        local_d8.data._M_elems[0xc] = 0;
        local_d8.data._M_elems[0xd] = 0;
        local_d8.data._M_elems._56_5_ = 0;
        local_d8.data._M_elems[0xf]._1_3_ = 0;
        local_d8.exp = 0;
        local_d8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_d8,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)(this->u).row.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar16),&local_128);
        pnVar9 = (this->l).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (uint *)((long)pnVar9[iVar12].m_backend.data._M_elems + 0x30);
        *(undefined8 *)puVar1 = local_d8.data._M_elems._48_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT35(local_d8.data._M_elems[0xf]._1_3_,local_d8.data._M_elems._56_5_);
        puVar1 = (uint *)((long)pnVar9[iVar12].m_backend.data._M_elems + 0x20);
        *(undefined8 *)puVar1 = local_d8.data._M_elems._32_8_;
        *(undefined8 *)(puVar1 + 2) = local_d8.data._M_elems._40_8_;
        puVar1 = (uint *)((long)pnVar9[iVar12].m_backend.data._M_elems + 0x10);
        *(undefined8 *)puVar1 = local_d8.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_d8.data._M_elems._24_8_;
        *(undefined8 *)pnVar9[iVar12].m_backend.data._M_elems = local_d8.data._M_elems._0_8_;
        *(undefined8 *)((long)pnVar9[iVar12].m_backend.data._M_elems + 8) =
             local_d8.data._M_elems._8_8_;
        pnVar9[iVar12].m_backend.exp = local_d8.exp;
        pnVar9[iVar12].m_backend.neg = local_d8.neg;
        pnVar9[iVar12].m_backend.fpclass = local_d8.fpclass;
        pnVar9[iVar12].m_backend.prec_elem = local_d8.prec_elem;
        iVar12 = iVar12 + 1;
        piVar7 = (this->u).row.idx;
        *(int *)((long)piVar7 + lVar18) = piVar7[lVar14];
        pnVar9 = (this->u).row.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)
                   ((long)pnVar9[-1].m_backend.data._M_elems + lVar16),&pnVar9[lVar14].m_backend);
        if (iVar5 == 2) {
          iVar5 = (this->temp).stage;
          (this->temp).stage = iVar5 + 1;
          piVar8[iVar5] = iVar13;
        }
        else if (iVar5 == 1) {
          this->stat = SINGULAR;
          return;
        }
      }
    }
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::rowSingletons()
{
   R pval;
   int i, j, k, ll, r;
   int p_row, p_col, len, rs, lk;
   int* idx;
   int* rperm = row.perm;
   int* sing = temp.s_mark;

   /*  Mark row singletons
    */
   rs = temp.stage;

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0 && u.row.len[i] == 1)
         sing[temp.stage++] = i;
   }

   /*  Eliminate row singletons
    *  thereby marking newly arising ones
    *  until no more can be found.
    */
   for(; rs < temp.stage; ++rs)
   {
      /*      Move pivot element from row file to diag
       */
      p_row = sing[rs];
      j = u.row.start[p_row];
      p_col = u.row.idx[j];
      pval = u.row.val[j];
      setPivot(rs, p_col, p_row, pval);
      u.row.len[p_row] = 0;

      /*      Remove pivot column form workingmatrix
       *      thereby building up L VectorBase<R>.
       */
      idx = &(u.col.idx[u.col.start[p_col]]);
      i = temp.s_cact[p_col];                /* nr. nonzeros of new L VectorBase<R> */
      lk = makeLvec(i - 1, p_row);
      len = u.col.len[p_col];
      i = (u.col.len[p_col] -= i);         /* remove pivot column from U */

      for(; i < len; ++i)
      {
         r = idx[i];

         if(r != p_row)
         {
            /*      Find pivot column in row.
             */
            ll = --(u.row.len[r]);
            k = u.row.start[r] + ll;

            for(j = k; u.row.idx[j] != p_col; --j)
               ;

            assert(k >= u.row.start[r]);

            /*      Initialize L VectorBase<R>
             */
            l.idx[lk] = r;

            l.val[lk] = u.row.val[j] / pval;

            ++lk;

            /*      Remove pivot column from row.
             */
            u.row.idx[j] = u.row.idx[k];

            u.row.val[j] = u.row.val[k];

            /*      Check new row length.
             */
            if(ll == 1)
               sing[temp.stage++] = r;
            else if(ll == 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }
         }
      }
   }
}